

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::ShaderSubroutine::NegativeTest10::getTessellationControlShader_abi_cxx11_
          (string *__return_storage_ptr__,NegativeTest10 *this,bool include_duplicate_function)

{
  stringstream result_sstream;
  stringstream local_1a0 [16];
  undefined1 local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "#version 400\n\n#extension GL_ARB_shader_subroutine : require\n\nlayout (vertices = 4) out;\n\nsubroutine void subroutineType(inout vec4 test);\n\nsubroutine(subroutineType) void test_function(inout vec4 test)\n{\n    test = vec4(2, 3, 4, 5);\n}\n\nsubroutine uniform subroutineType function;\n\n"
             ,0x119);
  if (include_duplicate_function) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "void test_function(inout vec4 test)\n{\n    test = vec4(3, 4, 5, 6);\n}\n\n",0x46);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "void main()\n{\n    vec4 temp;\n\n    function(temp);\n\n    gl_out[gl_InvocationID].gl_Position = temp;\n    gl_TessLevelInner[0]                = temp.x;\n    gl_TessLevelInner[1]                = temp.y;\n    gl_TessLevelOuter[0]                = temp.z;\n    gl_TessLevelOuter[1]                = temp.w;\n    gl_TessLevelOuter[2]                = temp.x;\n    gl_TessLevelOuter[3]                = temp.y;\n}\n"
             ,0x191);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string NegativeTest10::getTessellationControlShader(bool include_duplicate_function)
{
	std::stringstream result_sstream;

	result_sstream << "#version 400\n"
					  "\n"
					  "#extension GL_ARB_shader_subroutine : require\n"
					  "\n"
					  "layout (vertices = 4) out;\n"
					  "\n"
					  "subroutine void subroutineType(inout vec4 test);\n"
					  "\n"
					  "subroutine(subroutineType) void test_function(inout vec4 test)\n"
					  "{\n"
					  "    test = vec4(2, 3, 4, 5);\n"
					  "}\n"
					  "\n"
					  "subroutine uniform subroutineType function;\n"
					  "\n";

	if (include_duplicate_function)
	{
		result_sstream << "void test_function(inout vec4 test)\n"
						  "{\n"
						  "    test = vec4(3, 4, 5, 6);\n"
						  "}\n"
						  "\n";
	}

	result_sstream << "void main()\n"
					  "{\n"
					  "    vec4 temp;\n"
					  "\n"
					  "    function(temp);\n"
					  "\n"
					  "    gl_out[gl_InvocationID].gl_Position = temp;\n"
					  "    gl_TessLevelInner[0]                = temp.x;\n"
					  "    gl_TessLevelInner[1]                = temp.y;\n"
					  "    gl_TessLevelOuter[0]                = temp.z;\n"
					  "    gl_TessLevelOuter[1]                = temp.w;\n"
					  "    gl_TessLevelOuter[2]                = temp.x;\n"
					  "    gl_TessLevelOuter[3]                = temp.y;\n"
					  "}\n";

	return result_sstream.str();
}